

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.cpp
# Opt level: O1

string * __thiscall
ast::RangeExpr::toString_abi_cxx11_(string *__return_storage_ptr__,RangeExpr *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  string __str;
  ostringstream msg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  uVar2 = this->init_value;
  uVar3 = -uVar2;
  if (0 < (int)uVar2) {
    uVar3 = uVar2;
  }
  uVar7 = 1;
  if (9 < uVar3) {
    uVar6 = (ulong)uVar3;
    uVar4 = 4;
    do {
      uVar7 = uVar4;
      uVar5 = (uint)uVar6;
      if (uVar5 < 100) {
        uVar7 = uVar7 - 2;
        goto LAB_001072da;
      }
      if (uVar5 < 1000) {
        uVar7 = uVar7 - 1;
        goto LAB_001072da;
      }
      if (uVar5 < 10000) goto LAB_001072da;
      uVar6 = uVar6 / 10000;
      uVar4 = uVar7 + 4;
    } while (99999 < uVar5);
    uVar7 = uVar7 + 1;
  }
LAB_001072da:
  paVar1 = &local_1c8.field_2;
  local_1c8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
            (&local_1c8,(ulong)(uVar7 + -((int)uVar2 >> 0x1f)),'-');
  std::__detail::__to_chars_10_impl<unsigned_int>
            (local_1c8._M_dataplus._M_p + (uint)-((int)uVar2 >> 0x1f),uVar7,uVar3);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,local_1c8._M_dataplus._M_p,local_1c8._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"..",2);
  uVar2 = this->end_value;
  uVar3 = -uVar2;
  if (0 < (int)uVar2) {
    uVar3 = uVar2;
  }
  uVar7 = 1;
  if (9 < uVar3) {
    uVar6 = (ulong)uVar3;
    uVar4 = 4;
    do {
      uVar7 = uVar4;
      uVar5 = (uint)uVar6;
      if (uVar5 < 100) {
        uVar7 = uVar7 - 2;
        goto LAB_001073a9;
      }
      if (uVar5 < 1000) {
        uVar7 = uVar7 - 1;
        goto LAB_001073a9;
      }
      if (uVar5 < 10000) goto LAB_001073a9;
      uVar6 = uVar6 / 10000;
      uVar4 = uVar7 + 4;
    } while (99999 < uVar5);
    uVar7 = uVar7 + 1;
  }
LAB_001073a9:
  local_1c8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
            (&local_1c8,(ulong)(uVar7 + -((int)uVar2 >> 0x1f)),'-');
  std::__detail::__to_chars_10_impl<unsigned_int>
            (local_1c8._M_dataplus._M_p + (uint)-((int)uVar2 >> 0x1f),uVar7,uVar3);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,local_1c8._M_dataplus._M_p,local_1c8._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string ast::RangeExpr::toString() const {
    std::ostringstream msg;
    msg << std::to_string(init_value);
    msg << "..";
    msg << std::to_string(end_value);
    return msg.str();
}